

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

void BinarySink_put_wpoint(BinarySink *bs,WeierstrassPoint *point,ec_curve *curve,_Bool bare)

{
  BinarySink *pBVar1;
  uint8_t uVar2;
  uint uVar3;
  size_t local_58;
  size_t i_1;
  size_t i;
  mp_int *y;
  mp_int *x;
  BinarySink *bs_inner;
  strbuf *sb;
  ec_curve *peStack_20;
  _Bool bare_local;
  ec_curve *curve_local;
  WeierstrassPoint *point_local;
  BinarySink *bs_local;
  
  x = (mp_int *)bs;
  sb._7_1_ = bare;
  peStack_20 = curve;
  curve_local = (ec_curve *)point;
  point_local = (WeierstrassPoint *)bs;
  if (!bare) {
    bs_inner = (BinarySink *)strbuf_new();
    x = (mp_int *)((strbuf *)bs_inner)->binarysink_;
  }
  uVar3 = ecc_weierstrass_is_identity((WeierstrassPoint *)curve_local);
  if (uVar3 == 0) {
    ecc_weierstrass_get_affine((WeierstrassPoint *)curve_local,&y,(mp_int **)&i);
    BinarySink_put_byte((BinarySink *)x[1].nw,'\x04');
    i_1 = peStack_20->fieldBytes;
    while (i_1 != 0) {
      pBVar1 = (BinarySink *)x[1].nw;
      uVar2 = mp_get_byte(y,i_1 - 1);
      BinarySink_put_byte(pBVar1,uVar2);
      i_1 = i_1 - 1;
    }
    local_58 = peStack_20->fieldBytes;
    while (local_58 != 0) {
      pBVar1 = (BinarySink *)x[1].nw;
      uVar2 = mp_get_byte((mp_int *)i,local_58 - 1);
      BinarySink_put_byte(pBVar1,uVar2);
      local_58 = local_58 - 1;
    }
    mp_free(y);
    mp_free((mp_int *)i);
  }
  else {
    BinarySink_put_byte((BinarySink *)x[1].nw,'\0');
  }
  if ((sb._7_1_ & 1) == 0) {
    BinarySink_put_stringsb((BinarySink *)point_local->Z,(strbuf *)bs_inner);
  }
  return;
}

Assistant:

static void BinarySink_put_wpoint(
    BinarySink *bs, WeierstrassPoint *point, const struct ec_curve *curve,
    bool bare)
{
    strbuf *sb;
    BinarySink *bs_inner;

    if (!bare) {
        /*
         * Encapsulate the raw data inside an outermost string layer.
         */
        sb = strbuf_new();
        bs_inner = BinarySink_UPCAST(sb);
    } else {
        /*
         * Just write the data directly to the output.
         */
        bs_inner = bs;
    }

    if (ecc_weierstrass_is_identity(point)) {
        put_byte(bs_inner, 0);
    } else {
        mp_int *x, *y;
        ecc_weierstrass_get_affine(point, &x, &y);

        /*
         * For ECDSA, we only ever output uncompressed points.
         */
        put_byte(bs_inner, 0x04);
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(x, i));
        for (size_t i = curve->fieldBytes; i--;)
            put_byte(bs_inner, mp_get_byte(y, i));

        mp_free(x);
        mp_free(y);
    }

    if (!bare)
        put_stringsb(bs, sb);
}